

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptor::DebugString
          (EnumValueDescriptor *this,int depth,string *contents,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  int value;
  EnumValueOptions *from;
  EnumDescriptor *this_00;
  FileDescriptor *this_01;
  DescriptorPool *options;
  Arg *a0;
  string_view sVar2;
  Arg *in_stack_fffffffffffffd18;
  Arg local_268;
  string_view local_238;
  undefined1 local_228 [8];
  string formatted_options;
  EnumValueOptions full_options;
  Arg local_168;
  Arg local_138;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined1 local_f8 [8];
  SourceLocationCommentPrinter comment_printer;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string prefix;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  EnumValueDescriptor *this_local;
  
  prefix.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator(&local_49);
  anon_unknown_24::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::EnumValueDescriptor>
            ((SourceLocationCommentPrinter *)local_f8,this,(string *)local_48,
             (DebugStringOptions *)prefix.field_2._8_8_);
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"$0$1 = $2");
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  sVar2 = name(this);
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_168,sVar2);
  value = number(this);
  absl::lts_20250127::substitute_internal::Arg::Arg
            ((Arg *)((long)&full_options.field_0 + 0x48),value);
  a0 = &local_168;
  sVar2._M_str = (char *)&local_138;
  sVar2._M_len = (size_t)local_108._M_str;
  absl::lts_20250127::SubstituteAndAppend
            ((lts_20250127 *)contents,(Nonnull<std::string_*>)local_108._M_len,sVar2,a0,
             (Arg *)((long)&full_options.field_0 + 0x48),in_stack_fffffffffffffd18);
  from = EnumValueDescriptor::options(this);
  EnumValueOptions::EnumValueOptions
            ((EnumValueOptions *)((long)&formatted_options.field_2 + 8),from);
  anon_unknown_24::CopyFeaturesToOptions<google::protobuf::EnumValueOptions>
            (this->proto_features_,(EnumValueOptions *)((long)&formatted_options.field_2 + 8));
  std::__cxx11::string::string((string *)local_228);
  this_00 = type(this);
  this_01 = EnumDescriptor::file(this_00);
  options = FileDescriptor::pool(this_01);
  bVar1 = anon_unknown_24::FormatBracketedOptions
                    ((anon_unknown_24 *)(ulong)(uint)depth,(int)&formatted_options + 0x18,
                     (Message *)options,(DescriptorPool *)local_228,(string *)a0);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_238," [$0]");
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
              (&local_268,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    absl::lts_20250127::SubstituteAndAppend(contents,local_238,&local_268);
  }
  std::__cxx11::string::append((char *)contents);
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  std::__cxx11::string::~string((string *)local_228);
  EnumValueOptions::~EnumValueOptions((EnumValueOptions *)((long)&formatted_options.field_2 + 8));
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void EnumValueDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(contents, "$0$1 = $2", prefix, name(), number());

  EnumValueOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  std::string formatted_options;
  if (FormatBracketedOptions(depth, full_options, type()->file()->pool(),
                             &formatted_options)) {
    absl::SubstituteAndAppend(contents, " [$0]", formatted_options);
  }
  contents->append(";\n");

  comment_printer.AddPostComment(contents);
}